

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger default_delegate_tointeger(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  bool bVar3;
  SQObjectPtr *pSVar4;
  SQInteger SVar5;
  SQChar *pSVar6;
  SQRESULT SVar7;
  SQObjectValue SVar8;
  byte bVar9;
  SQChar *__nptr;
  bool bVar10;
  SQObjectPtr res;
  SQInteger base;
  SQObjectPtr local_48;
  SQObjectPtr *local_38;
  SQObjectPtr local_30;
  
  pSVar4 = SQVM::GetAt(v,v->_stackbase);
  local_38 = (SQObjectPtr *)0xa;
  SVar5 = sq_gettop(v);
  if (1 < SVar5) {
    sq_getinteger(v,2,(SQInteger *)&local_38);
  }
  SVar2 = (pSVar4->super_SQObject)._type;
  if ((int)SVar2 < 0x5000004) {
    if (SVar2 == OT_BOOL) {
      local_48.super_SQObject._unVal.nInteger._1_7_ = 0;
      local_48.super_SQObject._unVal.nInteger._0_1_ =
           (pSVar4->super_SQObject)._unVal.pTable != (SQTable *)0x0;
      local_48.super_SQObject._0_5_ = 0x5000002;
      SQVM::Push(v,&local_48);
      goto LAB_0011f3da;
    }
    if (SVar2 != OT_INTEGER) {
LAB_0011f2f7:
      SQVM::PushNull(v);
      return 1;
    }
  }
  else if (SVar2 != OT_FLOAT) {
    if (SVar2 != OT_STRING) goto LAB_0011f2f7;
    local_48.super_SQObject._unVal.pTable = (SQTable *)0x0;
    local_48.super_SQObject._type = OT_NULL;
    local_48.super_SQObject._flags = '\0';
    local_48.super_SQObject._5_3_ = 0;
    __nptr = ((pSVar4->super_SQObject)._unVal.pString)->_val;
    pSVar6 = __nptr;
    do {
      bVar9 = *pSVar6;
      if (bVar9 == 0) {
        SVar8.nInteger = strtoll(__nptr,(char **)&local_30,(int)local_38);
        bVar10 = (undefined1 *)CONCAT44(local_30.super_SQObject._4_4_,local_30.super_SQObject._type)
                 == __nptr;
        bVar3 = !bVar10;
        if (bVar10) goto LAB_0011f2c4;
        if ((local_48.super_SQObject._0_8_ & 0x8000000) != 0) {
          pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._vptr_SQRefCounted[2])();
          }
        }
        local_48.super_SQObject._0_5_ = 0x5000002;
        local_48.super_SQObject._unVal.nInteger = SVar8.nInteger;
        goto LAB_0011f39e;
      }
    } while ((bVar9 != 0x2e) &&
            ((pSVar6 = pSVar6 + 1, 0xd < (long)local_38 || (bVar9 = bVar9 & 0xdf, bVar9 != 0x45))));
    bVar3 = sq_parse_float(__nptr,(SQChar *)&local_48,local_38,(ulong)bVar9);
LAB_0011f2c4:
    if (bVar3 == false) {
      SQObjectPtr::~SQObjectPtr(&local_48);
      SVar7 = sq_throwerror(v,"cannot convert the string");
      return SVar7;
    }
LAB_0011f39e:
    local_30.super_SQObject._unVal = local_48.super_SQObject._unVal;
    if (local_48.super_SQObject._type == OT_FLOAT) {
      local_30.super_SQObject._unVal.nInteger = (long)local_48.super_SQObject._unVal.fFloat;
    }
    local_30.super_SQObject._type = OT_INTEGER;
    local_30.super_SQObject._4_4_ = local_30.super_SQObject._4_4_ & 0xffffff00;
    SQVM::Push(v,&local_30);
    SQObjectPtr::~SQObjectPtr(&local_30);
    goto LAB_0011f3da;
  }
  if ((pSVar4->super_SQObject)._type == OT_FLOAT) {
    local_48.super_SQObject._unVal.nInteger = (SQInteger)(pSVar4->super_SQObject)._unVal.fFloat;
  }
  else {
    local_48.super_SQObject._unVal = (pSVar4->super_SQObject)._unVal;
  }
  local_48.super_SQObject._0_5_ = 0x5000002;
  SQVM::Push(v,&local_48);
LAB_0011f3da:
  SQObjectPtr::~SQObjectPtr(&local_48);
  return 1;
}

Assistant:

static SQInteger default_delegate_tointeger(HSQUIRRELVM v)
{
    SQObjectPtr &o=stack_get(v,1);
    SQInteger base = 10;
    if(sq_gettop(v) > 1) {
        sq_getinteger(v,2,&base);
    }
    switch(sq_type(o)){
    case OT_STRING:{
        SQObjectPtr res;
        if(sq_parse_int(_stringval(o), _stringval(o) + _string(o)->_len, res, base)){
            v->Push(SQObjectPtr(tointeger(res)));
            break;
        }}
        return sq_throwerror(v, _SC("cannot convert the string"));
        break;
    case OT_INTEGER:case OT_FLOAT:
        v->Push(SQObjectPtr(tointeger(o)));
        break;
    case OT_BOOL:
        v->Push(SQObjectPtr(_integer(o)?(SQInteger)1:(SQInteger)0));
        break;
    default:
        v->PushNull();
        break;
    }
    return 1;
}